

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

void __thiscall
toml::basic_value<toml::type_config>::basic_value
          (void *param_1,byte param_2,undefined8 param_3,region *param_4)

{
  region *in_stack_ffffffffffffff98;
  
  *(undefined1 *)param_1 = 1;
  toml::detail::value_with_format<bool,_toml::boolean_format_info>::value_with_format
            ((value_with_format<bool,_toml::boolean_format_info> *)((long)param_1 + 8),param_2 & 1);
  toml::detail::region::region(param_4,in_stack_ffffffffffffff98);
  preserve_comments::preserve_comments
            ((preserve_comments *)param_4,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffff98);
  return;
}

Assistant:

basic_value(boolean_type x, boolean_format_info fmt,
                std::vector<std::string> com, region_type reg)
        : type_(value_t::boolean), boolean_(boolean_storage(x, fmt)),
          region_(std::move(reg)), comments_(std::move(com))
    {}